

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall
el::base::DefaultLogDispatchCallback::handle(DefaultLogDispatchCallback *this,LogDispatchData *data)

{
  DispatchAction DVar1;
  LogMessage *pLVar2;
  Logger *this_00;
  LogBuilder *pLVar3;
  string_t local_38;
  LogDispatchData *local_18;
  LogDispatchData *data_local;
  DefaultLogDispatchCallback *this_local;
  
  this->m_data = data;
  local_18 = data;
  data_local = (LogDispatchData *)this;
  pLVar2 = LogDispatchData::logMessage(this->m_data);
  this_00 = LogMessage::logger(pLVar2);
  pLVar3 = Logger::logBuilder(this_00);
  pLVar2 = LogDispatchData::logMessage(this->m_data);
  DVar1 = LogDispatchData::dispatchAction(this->m_data);
  (*pLVar3->_vptr_LogBuilder[2])(&local_38,pLVar3,pLVar2,(ulong)(DVar1 == NormalLog));
  dispatch(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void DefaultLogDispatchCallback::handle(const LogDispatchData* data) {
#if defined(ELPP_THREAD_SAFE)
  LogDispatchCallback::handle(data);
  base::threading::ScopedLock scopedLock(fileHandle(data));
#endif
  m_data = data;
  dispatch(m_data->logMessage()->logger()->logBuilder()->build(m_data->logMessage(),
           m_data->dispatchAction() == base::DispatchAction::NormalLog));
}